

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::VRegistry::setModules(VRegistry *this,char *modules)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  stringstream ss;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  std::__cxx11::stringstream::stringstream(local_1b8);
  cVar2 = *modules;
  if (cVar2 == '\0') {
    uVar4 = 0xffffffff;
  }
  else {
    pcVar5 = modules + 1;
    bVar3 = true;
    uVar4 = 0xffffffff;
    bVar6 = false;
    do {
      if (cVar2 == '=') {
        bVar3 = false;
        bVar6 = true;
      }
      else if (cVar2 == ',') {
        std::__cxx11::stringbuf::str();
        bVar6 = local_1d0 != 0;
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        bVar3 = true;
        if (bVar6 && uVar4 != 0xffffffff) {
          setModules::anon_class_16_2_658133bf::operator()
                    ((anon_class_16_2_658133bf *)this,(stringstream *)local_1b8,(VerboseLevel)uVar4)
          ;
          local_1d8 = local_1c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8);
          }
          uVar4 = 0xffffffff;
        }
        bVar6 = false;
      }
      else if (bVar3) {
        local_1d8 = (undefined1 *)CONCAT71(local_1d8._1_7_,cVar2);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
        bVar3 = true;
      }
      else {
        uVar1 = (int)cVar2 - 0x30U;
        if (9 < (int)cVar2 - 0x30U) {
          uVar1 = uVar4;
        }
        if (bVar6) {
          uVar4 = uVar1;
        }
        bVar3 = false;
      }
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  std::__cxx11::stringbuf::str();
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (uVar4 != 0xffffffff && local_1d0 != 0) {
    setModules::anon_class_16_2_658133bf::operator()
              ((anon_class_16_2_658133bf *)this,(stringstream *)local_1b8,(VerboseLevel)uVar4);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void VRegistry::setModules(const char* modules) {
  base::threading::ScopedLock scopedLock(lock());
  auto addSuffix = [](std::stringstream& ss, const char* sfx, const char* prev) {
    if (prev != nullptr && base::utils::Str::endsWith(ss.str(), std::string(prev))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(prev)));
      ss.str(std::string(""));
      ss << chr;
    }
    if (base::utils::Str::endsWith(ss.str(), std::string(sfx))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(sfx)));
      ss.str(std::string(""));
      ss << chr;
    }
    ss << sfx;
  };
  auto insert = [&](std::stringstream& ss, base::type::VerboseLevel level) {
    if (!base::utils::hasFlag(LoggingFlag::DisableVModulesExtensions, *m_pFlags)) {
      addSuffix(ss, ".h", nullptr);
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".c", ".h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cpp", ".c");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cc", ".cpp");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cxx", ".cc");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".-inl.h", ".cxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hxx", ".-inl.h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hpp", ".hxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hh", ".hpp");
    }
    m_modules.insert(std::make_pair(ss.str(), level));
  };
  bool isMod = true;
  bool isLevel = false;
  std::stringstream ss;
  int level = -1;
  for (; *modules; ++modules) {
    switch (*modules) {
    case '=':
      isLevel = true;
      isMod = false;
      break;
    case ',':
      isLevel = false;
      isMod = true;
      if (!ss.str().empty() && level != -1) {
        insert(ss, static_cast<base::type::VerboseLevel>(level));
        ss.str(std::string(""));
        level = -1;
      }
      break;
    default:
      if (isMod) {
        ss << *modules;
      } else if (isLevel) {
        if (isdigit(*modules)) {
          level = static_cast<base::type::VerboseLevel>(*modules) - 48;
        }
      }
      break;
    }
  }
  if (!ss.str().empty() && level != -1) {
    insert(ss, static_cast<base::type::VerboseLevel>(level));
  }
}